

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O1

int mriStep_SetNonlinear(ARKodeMem ark_mem)

{
  int iVar1;
  ARKodeMRIStepMem in_RAX;
  ARKodeMRIStepMem step_mem;
  ARKodeMRIStepMem local_8;
  
  local_8 = in_RAX;
  iVar1 = mriStep_AccessStepMem(ark_mem,"mriStep_SetNonlinear",&local_8);
  if (iVar1 == 0) {
    local_8->linear = 0;
    local_8->linear_timedep = 1;
    local_8->dgmax = 0.2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mriStep_SetNonlinear(ARKodeMem ark_mem)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set parameters */
  step_mem->linear         = SUNFALSE;
  step_mem->linear_timedep = SUNTRUE;
  step_mem->dgmax          = DGMAX;

  return (ARK_SUCCESS);
}